

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_colorful(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch_00;
  __type_conflict2 _Var3;
  CHAR_DATA *victim;
  char arg [500];
  char arg1 [500];
  char *parg;
  AFFECT_DATA af;
  char *in_stack_00000d70;
  CHAR_DATA *in_stack_00000d78;
  CHAR_DATA *in_stack_fffffffffffffb68;
  char *in_stack_fffffffffffffb70;
  char in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb79;
  char *in_stack_fffffffffffffb80;
  char local_288;
  
  one_argument(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
  one_argument(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
  if ((((local_288 == '\0') ||
       (ch_00 = get_char_room(in_stack_00000d78,in_stack_00000d70), ch_00 == (CHAR_DATA *)0x0)) ||
      (in_stack_fffffffffffffb78 == '\0')) ||
     (((bVar1 = is_number((char *)in_stack_fffffffffffffb68), !bVar1 ||
       (iVar2 = atoi(&stack0xfffffffffffffb78), iVar2 < 0)) ||
      (bVar1 = is_npc(in_stack_fffffffffffffb68), bVar1)))) {
    send_to_char(in_stack_fffffffffffffb80,
                 (CHAR_DATA *)CONCAT71(in_stack_fffffffffffffb79,in_stack_fffffffffffffb78));
  }
  else {
    init_affect((AFFECT_DATA *)0x6228da);
    atoi(&stack0xfffffffffffffb78);
    affect_to_char(ch_00,(AFFECT_DATA *)in_stack_fffffffffffffb68);
    _Var3 = std::pow<int,int>(0,0x622975);
    ch_00->comm[0] = (long)_Var3 | ch_00->comm[0];
  }
  return;
}

Assistant:

void spell_colorful(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	char *parg, arg1[500], arg[500];
	CHAR_DATA *victim;

	parg = one_argument(target_name, arg1);
	one_argument(parg, arg);

	if (arg1[0] == '\0'
		|| !(victim = get_char_room(ch, arg1))
		|| arg[0] == '\0'
		|| !is_number(arg)
		|| atoi(arg) < 0
		|| is_npc(victim))
	{
		send_to_char("Syntax: c colorful target duration\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.type = sn;
	af.level = ch->level;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.duration = atoi(arg);
	af.end_fun = colorful_end;
	af.mod_name = MOD_VISION;
	affect_to_char(victim, &af);

	SET_BIT(victim->comm, COMM_LOTS_O_COLOR);
}